

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int tr_send_all(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  long in_FS_OFFSET;
  uint local_4c;
  int rtval;
  uint total_send;
  time_t timeout_local;
  size_t len_local;
  void *pdu_local;
  tr_socket *socket_local;
  long local_20;
  time_t cur_time;
  time_t end_time;
  
  end_time = *(time_t *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  lrtr_get_monotonic_time(&cur_time);
  cur_time = cur_time + timeout;
  for (; local_4c < len; local_4c = socket_local._4_4_ + local_4c) {
    lrtr_get_monotonic_time(&local_20);
    socket_local._4_4_ =
         tr_send(socket,(void *)((long)pdu + (ulong)local_4c),len - local_4c,cur_time - local_20);
    if ((int)socket_local._4_4_ < 0) goto LAB_00109f1a;
  }
  socket_local._4_4_ = local_4c;
LAB_00109f1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != end_time) {
    __stack_chk_fail();
  }
  return socket_local._4_4_;
}

Assistant:

int tr_send_all(const struct tr_socket *socket, const void *pdu, const size_t len, const time_t timeout)
{
	unsigned int total_send = 0;
	time_t end_time;

	lrtr_get_monotonic_time(&end_time);
	end_time = end_time + timeout;

	while (total_send < len) {
		time_t cur_time;
		int rtval;

		lrtr_get_monotonic_time(&cur_time);

		rtval = tr_send(socket, ((char *)pdu) + total_send, (len - total_send), (end_time - cur_time));
		if (rtval < 0)
			return rtval;
		total_send += rtval;
	}
	return total_send;
}